

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O0

MPI_Comm GA_MPI_Comm_pgroup(int p_grp)

{
  undefined4 in_EAX;
  MPI_Comm poVar1;
  int in_EDI;
  ARMCI_Group group;
  ARMCI_Group local_8;
  int local_4;
  
  _local_8 = CONCAT44(in_EDI,in_EAX);
  if (in_EDI < 1) {
    ARMCI_Group_get_world(&local_8);
  }
  else {
    _local_8 = CONCAT44(in_EDI,PGRP_LIST[in_EDI].group);
  }
  poVar1 = armci_group_comm((ARMCI_Group *)CONCAT44(p_grp,group));
  return poVar1;
}

Assistant:

MPI_Comm GA_MPI_Comm_pgroup(int p_grp)
{
    ARMCI_Group group;
    if (p_grp > 0) {
        group = PGRP_LIST[p_grp].group;
    }
    else {
        ARMCI_Group_get_world(&group);
    }
#   if HAVE_ARMCI_GROUP_COMM_MEMBER
    return group.comm;
#   else
    return armci_group_comm(&group);
#   endif
}